

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::MakeTimestampFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  bool bVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ScalarFunction,_true> *__range1;
  ScalarFunctionSet *operator_set;
  allocator_type *in_stack_fffffffffffffa08;
  ScalarFunction *pSVar4;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffa10;
  ScalarFunction *pSVar5;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffa18;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa24;
  LogicalType *local_568;
  LogicalType *local_548;
  BaseScalarFunction local_520 [176];
  reference local_470;
  ScalarFunction *local_468;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_460;
  ScalarFunctionSet *local_458;
  LogicalType local_450 [24];
  undefined1 local_438 [32];
  LogicalType local_418 [32];
  LogicalType *local_3f8;
  LogicalType local_3f0 [24];
  LogicalType *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [24];
  ScalarFunction local_3b0;
  LogicalType local_288 [24];
  undefined1 local_270 [32];
  LogicalType local_250 [32];
  LogicalType *local_230;
  LogicalType local_228 [24];
  LogicalType local_210 [24];
  LogicalType local_1f8 [24];
  LogicalType local_1e0 [24];
  LogicalType local_1c8 [24];
  LogicalType local_1b0 [24];
  LogicalType *local_198;
  undefined8 local_190;
  undefined1 local_188 [24];
  ScalarFunction local_170;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"make_timestamp",&local_31);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_230 = local_228;
  duckdb::LogicalType::LogicalType(local_230,BIGINT);
  local_230 = local_210;
  duckdb::LogicalType::LogicalType(local_230,BIGINT);
  local_230 = local_1f8;
  duckdb::LogicalType::LogicalType(local_230,BIGINT);
  local_230 = local_1e0;
  duckdb::LogicalType::LogicalType(local_230,BIGINT);
  local_230 = local_1c8;
  duckdb::LogicalType::LogicalType(local_230,BIGINT);
  local_230 = local_1b0;
  duckdb::LogicalType::LogicalType(local_230,DOUBLE);
  local_198 = local_228;
  local_190 = 6;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf6b97);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffa20;
  iVar1._M_array = (iterator)in_stack_fffffffffffffa18;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffa24;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffa10,iVar1,in_stack_fffffffffffffa08);
  duckdb::LogicalType::LogicalType(local_250,TIMESTAMP);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),in_stack_fffffffffffffa18
            );
  duckdb::LogicalType::LogicalType(local_288,INVALID);
  __f = local_288;
  uVar6 = 0;
  pSVar5 = (ScalarFunction *)0x0;
  pSVar4 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_170,local_188,local_250,local_270,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar5,pSVar4);
  ScalarFunction::~ScalarFunction(pSVar5);
  duckdb::LogicalType::~LogicalType(local_288);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf6c98);
  duckdb::LogicalType::~LogicalType(local_250);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf6cb2);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf6cbf);
  local_548 = (LogicalType *)&local_198;
  do {
    local_548 = local_548 + -0x18;
    duckdb::LogicalType::~LogicalType(local_548);
  } while (local_548 != local_228);
  local_3f8 = local_3f0;
  duckdb::LogicalType::LogicalType(local_3f8,BIGINT);
  local_3d8 = local_3f0;
  local_3d0 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf6d60);
  iVar2._M_len._0_4_ = uVar6;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffa24;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar5,iVar2,(allocator_type *)pSVar4);
  duckdb::LogicalType::LogicalType(local_418,TIMESTAMP);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa24,uVar6),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_450,INVALID);
  pSVar5 = (ScalarFunction *)0x0;
  pSVar4 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_3b0,local_3c8,local_418,local_438,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar5,pSVar4);
  ScalarFunction::~ScalarFunction(pSVar5);
  duckdb::LogicalType::~LogicalType(local_450);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf6e61);
  duckdb::LogicalType::~LogicalType(local_418);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf6e7b);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf6e88);
  local_568 = (LogicalType *)&local_3d8;
  do {
    local_568 = local_568 + -0x18;
    duckdb::LogicalType::~LogicalType(local_568);
  } while (local_568 != local_3f0);
  local_458 = in_RDI + 0x20;
  local_460._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin(pSVar4);
  local_468 = (ScalarFunction *)
              std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         pSVar4);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar5,
                            (__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar4), bVar3) {
    local_470 = __gnu_cxx::
                __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                ::operator*(&local_460);
    BaseScalarFunction::SetReturnsError(&pSVar4->super_BaseScalarFunction);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_520);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_460);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet MakeTimestampFun::GetFunctions() {
	ScalarFunctionSet operator_set("make_timestamp");
	operator_set.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT,
	                                         LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::DOUBLE},
	                                        LogicalType::TIMESTAMP, ExecuteMakeTimestamp<int64_t>));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP, ExecuteMakeTimestamp<int64_t>));

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return operator_set;
}